

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O0

void stbtt__hheap_cleanup(stbtt__hheap *hh,void *userdata)

{
  undefined8 *in_RDI;
  stbtt__hheap_chunk *n;
  stbtt__hheap_chunk *c;
  undefined8 local_18;
  
  local_18 = (undefined8 *)*in_RDI;
  while (local_18 != (undefined8 *)0x0) {
    local_18 = (undefined8 *)*local_18;
    ImGui::MemFree(local_18);
  }
  return;
}

Assistant:

static void stbtt__hheap_cleanup(stbtt__hheap *hh, void *userdata)
{
   stbtt__hheap_chunk *c = hh->head;
   while (c) {
      stbtt__hheap_chunk *n = c->next;
      STBTT_free(c, userdata);
      c = n;
   }
}